

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

pointer __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
make_terminal_matcher<pstore::json::details::string_matcher<callbacks_proxy<mock_json_callbacks>>,std::__cxx11::string*,bool_const&>
          (parser<callbacks_proxy<mock_json_callbacks>> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args,bool *args_1)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *in_RCX;
  pointer pVar3;
  not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_30;
  
  pbVar2 = *args;
  local_30.ptr_ = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)args_1;
  gsl::not_null<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
  ensure_invariant(&local_30);
  cVar1 = *in_RCX;
  *(undefined4 *)((long)&pbVar2[1].field_2 + 8) = 2;
  pbVar2[1].field_2._M_allocated_capacity = (size_type)&PTR__matcher_001be538;
  pbVar2[1].field_2._M_local_buf[0xc] = cVar1;
  *(undefined4 *)&pbVar2[2]._M_dataplus._M_p = 0;
  *(undefined2 *)((long)&pbVar2[2]._M_dataplus._M_p + 4) = 0x100;
  pbVar2[2]._M_string_length = (size_type)local_30.ptr_;
  *(undefined2 *)&pbVar2[2].field_2 = 0;
  *(undefined4 *)((long)&pbVar2[2].field_2 + 8) = 0;
  (local_30.ptr_)->_M_string_length = 0;
  *((local_30.ptr_)->_M_dataplus)._M_p = '\0';
  *this = (parser<callbacks_proxy<mock_json_callbacks>>)0x0;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)(this + 8) = &pbVar2[1].field_2;
  pVar3._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)&PTR__matcher_001be538;
  pVar3._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._0_8_ = this;
  return (pointer)pVar3._M_t.
                  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ;
}

Assistant:

auto parser<Callbacks>::make_terminal_matcher (Args &&... args) -> pointer {
            static_assert (sizeof (Matcher) <= sizeof (decltype (singletons_->terminal)),
                           "terminal storage is not large enough for Matcher type");
            static_assert (alignof (Matcher) <= alignof (decltype (singletons_->terminal)),
                           "terminal storage is not sufficiently aligned for Matcher type");

            return pointer (new (&singletons_->terminal) Matcher (std::forward<Args> (args)...),
                            typename pointer::deleter_type{false});
        }